

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

void __thiscall
xLearn::CSVParser::Parse(CSVParser *this,char *buf,uint64 size,DMatrix *matrix,bool reset)

{
  _Alloc_hider _Var1;
  size_type sVar2;
  uint64 uVar3;
  size_t sVar4;
  ostream *poVar5;
  _Alloc_hider _Var6;
  long lVar7;
  DMatrix *this_00;
  uint uVar8;
  ulong uVar9;
  index_t iVar10;
  long lVar11;
  uint64 pos;
  double dVar12;
  undefined1 auVar13 [16];
  float fVar14;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  str_vec;
  Logger local_ac;
  string local_a8;
  string local_80;
  float local_60;
  uint local_5c;
  uint64 local_58;
  CSVParser *local_50;
  char *local_48;
  long local_40;
  uint64 local_38;
  
  local_50 = this;
  local_48 = buf;
  if (buf == (char *)0x0) {
    local_ac.severity_ = ERR;
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_80,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/reader/parser.cc"
               ,"");
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"Parse","");
    poVar5 = Logger::Start(ERR,&local_80,0xcf,&local_a8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"CHECK failed ",0xd);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/reader/parser.cc"
               ,0x5e);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,":",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0xcf);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"buf",3);
    std::operator<<(poVar5," == NULL \n");
  }
  else {
    if (size != 0) {
      this_00 = (DMatrix *)this;
      if (reset) {
        this_00 = matrix;
        DMatrix::Reset(matrix);
      }
      local_a8._M_dataplus._M_p = (pointer)0x0;
      local_a8._M_string_length = 0;
      local_a8.field_2._M_allocated_capacity = 0;
      pos = 0;
      local_58 = size;
      do {
        uVar3 = Parser::get_line_from_buffer((Parser *)this_00,line_buf,local_48,pos,size);
        if (uVar3 != 0) {
          DMatrix::AddRow(matrix);
          sVar2 = local_a8._M_string_length;
          _Var1._M_p = local_a8._M_dataplus._M_p;
          iVar10 = matrix->row_length;
          _Var6._M_p = local_a8._M_dataplus._M_p;
          local_38 = pos;
          if ((pointer)local_a8._M_string_length != local_a8._M_dataplus._M_p) {
            do {
              if (*_Var6._M_p != _Var6._M_p + 0x10) {
                operator_delete(*_Var6._M_p);
              }
              _Var6._M_p = _Var6._M_p + 0x20;
            } while (_Var6._M_p != (pointer)sVar2);
            local_a8._M_string_length = (size_type)_Var1._M_p;
          }
          local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
          sVar4 = strlen(line_buf);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_80,line_buf,line_buf + sVar4);
          SplitStringUsing(&local_80,(local_50->super_Parser).splitor_._M_dataplus._M_p,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&local_a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80._M_dataplus._M_p != &local_80.field_2) {
            operator_delete(local_80._M_dataplus._M_p);
          }
          iVar10 = iVar10 - 1;
          uVar9 = local_a8._M_string_length - (long)local_a8._M_dataplus._M_p;
          this_00 = *(DMatrix **)local_a8._M_dataplus._M_p;
          dVar12 = atof((char *)this_00);
          local_40 = (long)(int)iVar10;
          (matrix->Y).super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start[local_40] = (float)dVar12;
          fVar14 = 0.0;
          uVar8 = (uint)(uVar9 >> 5);
          if (1 < (int)uVar8) {
            auVar13 = ZEXT416(0) << 0x20;
            lVar7 = 0x20;
            lVar11 = 0;
            do {
              local_5c = auVar13._0_4_;
              dVar12 = atof(*(char **)(local_a8._M_dataplus._M_p + lVar7));
              local_60 = (float)dVar12;
              this_00 = matrix;
              DMatrix::AddNode(matrix,iVar10,(index_t)lVar11,local_60,0);
              auVar13 = vfmadd213ss_fma(ZEXT416((uint)local_60),ZEXT416((uint)local_60),
                                        ZEXT416(local_5c));
              fVar14 = auVar13._0_4_;
              lVar11 = lVar11 + 1;
              lVar7 = lVar7 + 0x20;
            } while ((ulong)(uVar8 & 0x7fffffff) - 1 != lVar11);
          }
          pos = local_38 + uVar3;
          (matrix->norm).super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start[local_40] = 1.0 / fVar14;
          size = local_58;
        }
      } while (uVar3 != 0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_a8);
      return;
    }
    local_ac.severity_ = ERR;
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_80,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/reader/parser.cc"
               ,"");
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"Parse","");
    poVar5 = Logger::Start(ERR,&local_80,0xd0,&local_a8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"CHECK_GT failed ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/reader/parser.cc"
               ,0x5e);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,":",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0xd0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"size",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," = ",3);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"0",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," = ",3);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0);
    std::operator<<(poVar5,"\n");
  }
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_80);
  Logger::~Logger(&local_ac);
  abort();
}

Assistant:

void CSVParser::Parse(char* buf, 
                      uint64 size, 
                      DMatrix& matrix, 
                      bool reset) {
  CHECK_NOTNULL(buf);
  CHECK_GT(size, 0);
  // Clear the data matrix
  if (reset) { 
    matrix.Reset(); 
  }
  // Parse every line
  uint64 pos = 0;
  std::vector<std::string> str_vec;
  for (;;) {
    uint64 rd_size = get_line_from_buffer(line_buf, buf, pos, size);
    if (rd_size == 0) break;
    pos += rd_size;
    matrix.AddRow();
    int i = matrix.row_length - 1;
    str_vec.clear();
    SplitStringUsing(line_buf, splitor_.c_str(), &str_vec);
    int size = str_vec.size();
    // Add Y
    matrix.Y[i] = atof(str_vec[0].c_str());
    // Add features
    real_t norm = 0.0;
    for (int j = 1; j < size; ++j) {
      index_t idx = j-1;
      real_t value = atof(str_vec[j].c_str());
      matrix.AddNode(i, idx, value);
      norm += value*value;
    }
    norm = 1.0f / norm;
    matrix.norm[i] = norm;
  }
}